

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false>::PreventExtensions
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance)

{
  int *piVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar2;
  DictionaryTypeHandlerBase<int> *pDVar3;
  undefined8 extraout_RDX;
  
  pDVar3 = SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<int>,Js::PropertyRecord_const*>
                     ((SimpleDictionaryTypeHandlerBase<int,Js::JavascriptString*,false> *)this,
                      instance);
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->
            convertSimpleDictionaryToDictionaryCount;
  *piVar1 = *piVar1 + 1;
  UNRECOVERED_JUMPTABLE = (pDVar3->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36];
  iVar2 = (*UNRECOVERED_JUMPTABLE)(pDVar3,instance,extraout_RDX,UNRECOVERED_JUMPTABLE);
  return iVar2;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::PreventExtensions(DynamicObject* instance)
    {
        if (IsNotExtensibleSupported)
        {
            if ((this->GetFlags() & IsExtensibleFlag) == 0)
            {
                // Already not extensible => no further change needed.
                return TRUE;
            }

            if (!GetIsLocked())
            {
                // If the type is not shared with others, we can just change it by itself.
                return PreventExtensionsInternal(instance);
            }
        }

        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }